

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O2

void sequential(fdb_kvs_handle *kv,int pos)

{
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  uint uVar1;
  fdb_doc *doc;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [512];
  fdb_doc *local_450;
  uint local_444;
  fdb_kvs_handle *local_440;
  char local_438 [256];
  char local_338 [256];
  char local_238 [520];
  
  local_450 = (fdb_doc *)0x0;
  local_444 = pos;
  local_440 = kv;
  str_gen(local_238,0x200);
  for (uVar1 = 0; uVar1 != 1000; uVar1 = uVar1 + 1) {
    sprintf(local_338,"%d_%dseqkey",(ulong)local_444,(ulong)uVar1);
    sprintf(local_438,"meta%d",(ulong)uVar1);
    keylen = strlen(local_338);
    metalen = strlen(local_438);
    bodylen = strlen(local_238);
    fdb_doc_create(&local_450,local_338,keylen,local_438,metalen,local_238,bodylen);
    fdb_set(local_440,local_450);
    fdb_doc_free(local_450);
  }
  return;
}

Assistant:

void sequential(fdb_kvs_handle *kv, int pos) {

    int i;
    char keybuf[256], metabuf[256], bodybuf[512];
    fdb_doc *doc = NULL;
    str_gen(bodybuf, 512);

    // load flat keys
    for (i = 0; i < 1000; i++){
        sprintf(keybuf, "%d_%dseqkey", pos, i);
        sprintf(metabuf, "meta%d", i);
        fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
                       (void*)metabuf, strlen(metabuf),
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv, doc);
        fdb_doc_free(doc);
    }
}